

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O3

void __thiscall
glcts::SampleShadingRenderCase::~SampleShadingRenderCase(SampleShadingRenderCase *this)

{
  ~SampleShadingRenderCase(this);
  operator_delete(this,0x108);
  return;
}

Assistant:

SampleShadingRenderCase::~SampleShadingRenderCase()
{
}